

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetResponseFlag_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,ResponseFlagFor mode)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  string *psVar2;
  cmValue local_118;
  cmValue p;
  cmAlphaNum local_e0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string lang;
  string responseFlagVar;
  allocator<char> local_1e;
  byte local_1d;
  ResponseFlagFor local_1c;
  cmMakefileTargetGenerator *pcStack_18;
  ResponseFlagFor mode_local;
  cmMakefileTargetGenerator *this_local;
  string *responseFlag;
  
  local_1d = 0;
  local_1c = mode;
  pcStack_18 = this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"@",&local_1e)
  ;
  std::allocator<char>::~allocator(&local_1e);
  std::__cxx11::string::string((string *)(lang.field_2._M_local_buf + 8));
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_90,this);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_70,this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (local_1c == Link) {
    cmAlphaNum::cmAlphaNum(&local_e0,"CMAKE_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&p,(string *)local_70);
    cmStrCat<char[25]>(&local_b0,&local_e0,(cmAlphaNum *)&p,
                       (char (*) [25])"_RESPONSE_FILE_LINK_FLAG");
    std::__cxx11::string::operator=((string *)(lang.field_2._M_local_buf + 8),(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else if (local_1c == DeviceLink) {
    std::__cxx11::string::operator=
              ((string *)(lang.field_2._M_local_buf + 8),"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG"
              );
  }
  local_118 = cmMakefile::GetDefinition
                        ((this->super_cmCommonTargetGenerator).Makefile,
                         (string *)((long)&lang.field_2 + 8));
  bVar1 = cmValue::operator_cast_to_bool(&local_118);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_118);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar2);
  }
  local_1d = 1;
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(lang.field_2._M_local_buf + 8));
  if ((local_1d & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetResponseFlag(
  ResponseFlagFor mode) const
{
  std::string responseFlag = "@";
  std::string responseFlagVar;

  auto lang = this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  if (mode == cmMakefileTargetGenerator::ResponseFlagFor::Link) {
    responseFlagVar = cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_LINK_FLAG");
  } else if (mode == cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink) {
    responseFlagVar = "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG";
  }

  if (cmValue p = this->Makefile->GetDefinition(responseFlagVar)) {
    responseFlag = *p;
  }
  return responseFlag;
}